

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::implied(SimpSolver *this,vec<Minisat::Lit,_int> *c)

{
  uint uVar1;
  int iVar2;
  CRef CVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  bool bVar7;
  Size local_2c;
  
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x142,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
  }
  local_2c = (this->super_Solver).trail.sz;
  vec<int,_int>::push(&(this->super_Solver).trail_lim,&local_2c);
  iVar2 = c->sz;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      uVar1 = c->data[lVar6].x;
      if ((this->super_Solver).assigns.
          super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <= (int)uVar1 >> 1
         ) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar4 = (this->super_Solver).assigns.
              super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
              [(int)uVar1 >> 1].value;
      bVar5 = (byte)uVar1 & 1 ^ bVar4;
      bVar4 = bVar4 & 2;
      if (bVar5 == l_True && (l_True & 2) == 0 || (bVar4 & l_True) != 0) {
        bVar7 = true;
        goto LAB_0011011e;
      }
      if ((bVar5 != l_False || (l_False & 2) != 0) && (bVar4 & l_False) == 0) {
        if ((bVar5 != l_Undef || (l_Undef & 2) != 0) && (bVar4 & l_Undef) == 0) {
          __assert_fail("value(c[i]) == l_Undef",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                        ,0x14a,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
        }
        Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(uVar1 ^ 1),0xffffffff);
        iVar2 = c->sz;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  CVar3 = Solver::propagate(&this->super_Solver);
  bVar7 = CVar3 != 0xffffffff;
LAB_0011011e:
  Solver::cancelUntil(&this->super_Solver,0);
  return bVar7;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return true;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}